

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ProcessAnnotation
          (HtmlparserCppTest *this,string *annotation)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  bool bVar2;
  int iVar3;
  HtmlParser *this_00;
  const_iterator cVar4;
  mapped_type *ppHVar5;
  undefined8 extraout_RAX;
  pointer this_01;
  pointer str_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pairs;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SplitStringIntoKeyValuePairs(annotation,"=",",",&local_48);
  if (local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &this->parser_;
    p_Var1 = &(this->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = local_48.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        ValidateState(this,str);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if (iVar3 == 0) {
          ValidateTag(this,str);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)str_00);
          if (iVar3 == 0) {
            ValidateAttribute(this,str);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)str_00);
            if (iVar3 == 0) {
              ValidateValue(this,str);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)str_00);
              if (iVar3 == 0) {
                ValidateAttributeType(this,str);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)str_00);
                if (iVar3 == 0) {
                  ValidateAttributeQuoted(this,str);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar3 == 0) {
                    ValidateInJavascript(this,str);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar3 == 0) {
                      ValidateJavascriptQuoted(this,str);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar3 == 0) {
                        ValidateJavascriptState(this,str);
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar3 == 0) {
                          ValidateInCss(this,str);
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar3 == 0) {
                            ValidateLine(this,str);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar3 == 0) {
                              ValidateColumn(this,str);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar3 == 0) {
                                ValidateValueIndex(this,str);
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar3 == 0) {
                                  ValidateIsUrlStart(this,str);
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar3 == 0) {
                                    cVar4 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)this,str);
                                    if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar5 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&this->contextMap,str);
                                      *ppHVar5 = this_00;
                                    }
                                    ppHVar5 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&this->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar5,source);
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar3 == 0) {
                                      cVar4 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)this,str);
                                      if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&local_48);
                                        _Unwind_Resume(extraout_RAX);
                                      }
                                      ppHVar5 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&this->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar5);
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar3 == 0) {
                                        bVar2 = StringToBool(str);
                                        if (bVar2) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar3 == 0) {
                                          iVar3 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar3);
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar3 != 0) goto LAB_00107851;
                                          bVar2 = StringToBool(str);
                                          if (bVar2) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != local_48.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void HtmlparserCppTest::ProcessAnnotation(const string &annotation) {
  vector< pair< string, string > > pairs;
  SplitStringIntoKeyValuePairs(annotation, "=", ",", &pairs);

  vector< pair< string, string > >::iterator iter;

  iter = pairs.begin();
  for (iter = pairs.begin(); iter != pairs.end(); ++iter) {
    StripWhiteSpace(&iter->first);
    StripWhiteSpace(&iter->second);

    if (iter->first.compare("state") == 0) {
      ValidateState(iter->second);
    } else if (iter->first.compare("tag") == 0) {
      ValidateTag(iter->second);
    } else if (iter->first.compare("attr") == 0) {
      ValidateAttribute(iter->second);
    } else if (iter->first.compare("value") == 0) {
      ValidateValue(iter->second);
    } else if (iter->first.compare("attr_type") == 0) {
      ValidateAttributeType(iter->second);
    } else if (iter->first.compare("attr_quoted") == 0) {
      ValidateAttributeQuoted(iter->second);
    } else if (iter->first.compare("in_js") == 0) {
      ValidateInJavascript(iter->second);
    } else if (iter->first.compare("js_quoted") == 0) {
      ValidateJavascriptQuoted(iter->second);
    } else if (iter->first.compare("js_state") == 0) {
      ValidateJavascriptState(iter->second);
    } else if (iter->first.compare("in_css") == 0) {
      ValidateInCss(iter->second);
    } else if (iter->first.compare("line_number") == 0) {
      ValidateLine(iter->second);
    } else if (iter->first.compare("column_number") == 0) {
      ValidateColumn(iter->second);
    } else if (iter->first.compare("value_index") == 0) {
      ValidateValueIndex(iter->second);
    } else if (iter->first.compare("is_url_start") == 0) {
      ValidateIsUrlStart(iter->second);
    } else if (iter->first.compare("save_context") == 0) {
      if (!contextMap.count(iter->second)) {
        contextMap[iter->second] = new HtmlParser();
      }
      contextMap[iter->second]->CopyFrom(&parser_);
    } else if (iter->first.compare("load_context") == 0) {
      CHECK(contextMap.count(iter->second));
      parser_.CopyFrom(contextMap[iter->second]);
    } else if (iter->first.compare("reset") == 0) {
      if (StringToBool(iter->second)) {
        parser_.Reset();
      }
    } else if (iter->first.compare("reset_mode") == 0) {
      HtmlParser::Mode mode =
           static_cast<HtmlParser::Mode>(NameToId(kResetModeMap, iter->second));
      parser_.ResetMode(mode);
    } else if (iter->first.compare("insert_text") == 0) {
      if (StringToBool(iter->second)) {
        parser_.InsertText();
      }
    } else {
      FAIL() << "Unknown test directive: " << iter->first;
    }
  }
}